

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
::process_transition_event<afsm::test::events::power_on>
          (state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
           *this,power_on *event)

{
  event_process_result eVar1;
  transition_table_type<afsm::test::events::power_on> *ptVar2;
  indexes_tuple<0UL,_1UL> local_11;
  
  ptVar2 = state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
           ::transition_table<afsm::test::events::power_on,0ul,1ul>(&local_11);
  if (ptVar2->_M_elems[this->current_state_].super__Function_base._M_manager != (_Manager_type)0x0)
  {
    eVar1 = (**(code **)(((_Any_data *)(ptVar2->_M_elems + this->current_state_))->_M_pod_data +
                        0x18))((_Any_data *)(ptVar2->_M_elems + this->current_state_),this,event);
    return eVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

actions::event_process_result
    process_transition_event(Event&& event)
    {
        auto const& inv_table = transition_table<Event>( state_indexes{} );
        return inv_table[current_state()](*this, ::std::forward<Event>(event));
    }